

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O3

void __thiscall
moira::Moira::execAndiccr<(moira::Instr)61,(moira::Mode)11,(moira::Size)1>(Moira *this,u16 opcode)

{
  u16 uVar1;
  u32 uVar2;
  byte bVar3;
  
  uVar1 = (this->queue).irc;
  readExt(this);
  bVar3 = ((this->reg).sr.x << 4 |
          (this->reg).sr.n << 3 |
          (this->reg).sr.z << 2 | (this->reg).sr.v * '\x02' | (this->reg).sr.c) ^ (byte)uVar1;
  (*this->_vptr_Moira[0x19])(this,8);
  (this->reg).sr.c = (bool)(bVar3 & 1);
  (this->reg).sr.v = (bool)(bVar3 >> 1 & 1);
  (this->reg).sr.z = (bool)(bVar3 >> 2 & 1);
  (this->reg).sr.n = (bool)(bVar3 >> 3 & 1);
  (this->reg).sr.x = (bool)(bVar3 >> 4 & 1);
  readM<(moira::MemSpace)1,(moira::Size)2,0ul>(this,(this->reg).pc + 2);
  uVar2 = (this->reg).pc;
  (this->reg).pc0 = uVar2;
  (this->queue).ird = (this->queue).irc;
  uVar2 = readM<(moira::MemSpace)2,(moira::Size)2,4ul>(this,uVar2 + 2);
  (this->queue).irc = (u16)uVar2;
  return;
}

Assistant:

void
Moira::execAndiccr(u16 opcode)
{
    u32 src = readI<S>();
    u8  dst = getCCR();

    sync(8);

    u32 result = logic<I,S>(src, dst);
    setCCR(result);

    (void)readM<MEM_DATA, Word>(reg.pc+2);
    prefetch<POLLIPL>();
}